

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autosolve.cpp
# Opt level: O0

void enqueue_children(min_heap *to_expand,node *parent,Pyraminx *pyraminx,int g)

{
  Corner local_2c;
  int local_28;
  Corner ref_corner;
  int i;
  int g_local;
  Pyraminx *pyraminx_local;
  node *parent_local;
  min_heap *to_expand_local;
  
  ref_corner = g;
  _i = pyraminx;
  pyraminx_local = (Pyraminx *)parent;
  parent_local = (node *)to_expand;
  for (local_28 = 0; local_28 < 4; local_28 = local_28 + 1) {
    switch(local_28) {
    case 0:
      local_2c = U;
      break;
    case 1:
      local_2c = L;
      break;
    case 2:
      local_2c = R;
      break;
    case 3:
      local_2c = B;
    }
    enqueue_corner((min_heap *)parent_local,(node *)pyraminx_local,_i,&local_2c,ref_corner);
  }
  return;
}

Assistant:

void enqueue_children(min_heap& to_expand, const node* parent, Pyraminx& pyraminx, int g){
    for(int i = 0; i < 4; i++){
        Corner ref_corner;
        switch (i)
        {
        case 0:
            ref_corner = Corner::U;
            break;
        case 1:
            ref_corner = Corner::L;
            break;
        case 2:
            ref_corner = Corner::R;
            break;
        case 3:
            ref_corner = Corner::B;
            break;
        }
        enqueue_corner(to_expand, parent, pyraminx, ref_corner, g);
    }
}